

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O0

UChar * __thiscall
icu_63::BMPSet::span(BMPSet *this,UChar *s,UChar *limit,USetSpanCondition spanCondition)

{
  UChar UVar1;
  UChar UVar2;
  char cVar3;
  UBool UVar4;
  uint uVar5;
  int iVar6;
  uint32_t twoBits_1;
  int lead_1;
  uint32_t twoBits;
  int lead;
  UChar c2;
  UChar c;
  USetSpanCondition spanCondition_local;
  UChar *limit_local;
  UChar *s_local;
  BMPSet *this_local;
  
  limit_local = s;
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    do {
      UVar1 = *limit_local;
      if ((ushort)UVar1 < 0x100) {
        cVar3 = this->latin1Contains[(ushort)UVar1];
        goto joined_r0x003bbda5;
      }
      if ((ushort)UVar1 < 0x800) {
        uVar5 = this->table7FF[(int)((ushort)UVar1 & 0x3f)] &
                1 << ((byte)((int)(uint)(ushort)UVar1 >> 6) & 0x1f);
joined_r0x003bbd73:
        if (uVar5 != 0) {
          return limit_local;
        }
      }
      else {
        if (((ushort)UVar1 < 0xd800) || (0xdfff < (ushort)UVar1)) {
          iVar6 = (int)(uint)(ushort)UVar1 >> 0xc;
          uVar5 = this->bmpBlockBits[(int)((int)(uint)(ushort)UVar1 >> 6 & 0x3f)] >> (sbyte)iVar6 &
                  0x10001;
          if (1 < uVar5) {
            cVar3 = containsSlow(this,(uint)(ushort)UVar1,this->list4kStarts[iVar6],
                                 this->list4kStarts[iVar6 + 1]);
            goto joined_r0x003bbda5;
          }
          goto joined_r0x003bbd73;
        }
        if (((((ushort)UVar1 < 0xdc00) && (limit_local + 1 != limit)) &&
            (UVar2 = limit_local[1], 0xdbff < (ushort)UVar2)) && ((ushort)UVar2 < 0xe000)) {
          UVar4 = containsSlow(this,(uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + -0x35fdc00,
                               this->list4kStarts[0x10],this->list4kStarts[0x11]);
          if (UVar4 != '\0') {
            return limit_local;
          }
          limit_local = limit_local + 1;
        }
        else {
          cVar3 = containsSlow(this,(uint)(ushort)UVar1,this->list4kStarts[0xd],
                               this->list4kStarts[0xe]);
joined_r0x003bbda5:
          if (cVar3 != '\0') {
            return limit_local;
          }
        }
      }
      limit_local = limit_local + 1;
    } while (limit_local < limit);
  }
  else {
    do {
      UVar1 = *limit_local;
      if ((ushort)UVar1 < 0x100) {
        cVar3 = this->latin1Contains[(ushort)UVar1];
        goto joined_r0x003bbbec;
      }
      if ((ushort)UVar1 < 0x800) {
        uVar5 = this->table7FF[(int)((ushort)UVar1 & 0x3f)] &
                1 << ((byte)((int)(uint)(ushort)UVar1 >> 6) & 0x1f);
joined_r0x003bbbba:
        if (uVar5 == 0) {
          return limit_local;
        }
      }
      else {
        if (((ushort)UVar1 < 0xd800) || (0xdfff < (ushort)UVar1)) {
          iVar6 = (int)(uint)(ushort)UVar1 >> 0xc;
          uVar5 = this->bmpBlockBits[(int)((int)(uint)(ushort)UVar1 >> 6 & 0x3f)] >> (sbyte)iVar6 &
                  0x10001;
          if (1 < uVar5) {
            cVar3 = containsSlow(this,(uint)(ushort)UVar1,this->list4kStarts[iVar6],
                                 this->list4kStarts[iVar6 + 1]);
            goto joined_r0x003bbbec;
          }
          goto joined_r0x003bbbba;
        }
        if ((((ushort)UVar1 < 0xdc00) && (limit_local + 1 != limit)) &&
           ((UVar2 = limit_local[1], 0xdbff < (ushort)UVar2 && ((ushort)UVar2 < 0xe000)))) {
          UVar4 = containsSlow(this,(uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + -0x35fdc00,
                               this->list4kStarts[0x10],this->list4kStarts[0x11]);
          if (UVar4 == '\0') {
            return limit_local;
          }
          limit_local = limit_local + 1;
        }
        else {
          cVar3 = containsSlow(this,(uint)(ushort)UVar1,this->list4kStarts[0xd],
                               this->list4kStarts[0xe]);
joined_r0x003bbbec:
          if (cVar3 == '\0') {
            return limit_local;
          }
        }
      }
      limit_local = limit_local + 1;
    } while (limit_local < limit);
  }
  return limit_local;
}

Assistant:

const UChar *
BMPSet::span(const UChar *s, const UChar *limit, USetSpanCondition spanCondition) const {
    UChar c, c2;

    if(spanCondition) {
        // span
        do {
            c=*s;
            if(c<=0xff) {
                if(!latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))==0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits==0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(!containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c>=0xdc00 || (s+1)==limit || (c2=s[1])<0xdc00 || c2>=0xe000) {
                // surrogate code point
                if(!containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(!containsSlow(U16_GET_SUPPLEMENTARY(c, c2), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                ++s;
            }
        } while(++s<limit);
    } else {
        // span not
        do {
            c=*s;
            if(c<=0xff) {
                if(latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits!=0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c>=0xdc00 || (s+1)==limit || (c2=s[1])<0xdc00 || c2>=0xe000) {
                // surrogate code point
                if(containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(containsSlow(U16_GET_SUPPLEMENTARY(c, c2), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                ++s;
            }
        } while(++s<limit);
    }
    return s;
}